

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O0

pcp_errno pcp_db_rem_flow(pcp_flow_t *f)

{
  pcp_ctx_s *ppVar1;
  pcp_ctx_t *ctx;
  pcp_flow_t **fdb;
  pcp_flow_t *f_local;
  
  if ((f != (pcp_flow_t *)0x0) && (f->ctx != (pcp_ctx_s *)0x0)) {
    if (f->key_bucket != 0xffffffff) {
      ppVar1 = f->ctx;
      for (ctx = (pcp_ctx_t *)((ppVar1->pcp_db).flows + f->key_bucket); *(long *)ctx != 0;
          ctx = (pcp_ctx_t *)(*(long *)ctx + 0x90)) {
        if (*(pcp_flow_t **)ctx == f) {
          *(undefined4 *)(*(long *)ctx + 0x58) = 0xffffffff;
          *(undefined8 *)ctx = *(undefined8 *)(*(long *)ctx + 0x90);
          (ppVar1->pcp_db).flow_cnt = (ppVar1->pcp_db).flow_cnt - 1;
          return PCP_ERR_SUCCESS;
        }
      }
    }
    return PCP_ERR_NOT_FOUND;
  }
  __assert_fail("f && f->ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_client_db.c"
                ,0xbc,"pcp_errno pcp_db_rem_flow(pcp_flow_t *)");
}

Assistant:

pcp_errno pcp_db_rem_flow(pcp_flow_t *f) {
    pcp_flow_t **fdb = NULL;
    pcp_ctx_t *ctx;

    assert(f && f->ctx);

    if (f->key_bucket == EMPTY) {
        return PCP_ERR_NOT_FOUND;
    }

    ctx = f->ctx;
    PCP_LOG(PCP_LOGLVL_DEBUG, "Removing flow %p, key_bucket %d", f,
            f->key_bucket);

    for (fdb = ctx->pcp_db.flows + f->key_bucket; (*fdb) != NULL;
         fdb = &((*fdb)->next)) {
        if (*fdb == f) {
            (*fdb)->key_bucket = EMPTY;
            (*fdb) = (*fdb)->next;
            ctx->pcp_db.flow_cnt--;
            return PCP_ERR_SUCCESS;
        }
    }

    return PCP_ERR_NOT_FOUND;
}